

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O0

int check_ca(X509 *x)

{
  bool local_19;
  X509 *x_local;
  
  if (((x->ex_flags & 2) == 0) || ((x->ex_kusage & 4) != 0)) {
    if ((x->ex_flags & 0x2040) == 0x2040) {
      x_local._4_4_ = 1;
    }
    else {
      local_19 = false;
      if ((x->ex_flags & 1) != 0) {
        local_19 = (x->ex_flags & 0x10) != 0;
      }
      x_local._4_4_ = (uint)local_19;
    }
  }
  else {
    x_local._4_4_ = 0;
  }
  return x_local._4_4_;
}

Assistant:

static int check_ca(const X509 *x) {
  // keyUsage if present should allow cert signing
  if (ku_reject(x, X509v3_KU_KEY_CERT_SIGN)) {
    return 0;
  }
  // Version 1 certificates are considered CAs and don't have extensions.
  if ((x->ex_flags & V1_ROOT) == V1_ROOT) {
    return 1;
  }
  // Otherwise, it's only a CA if basicConstraints says so.
  return ((x->ex_flags & EXFLAG_BCONS) && (x->ex_flags & EXFLAG_CA));
}